

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_mac_tlv(oonf_layer2_neigh_key *key,dlep_session *session,dlep_parser_value *value)

{
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  oonf_layer2_neigh_key *key_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,7),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    key_local._4_4_ = -1;
  }
  else {
    key_local._4_4_ =
         netaddr_from_binary_prefix
                   (key,(session->parser).tlv_ptr + *(ushort *)(ptr + 4),*(undefined2 *)(ptr + 6),0,
                    0xff);
  }
  return key_local._4_4_;
}

Assistant:

int
dlep_reader_mac_tlv(struct oonf_layer2_neigh_key *key, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_MAC_ADDRESS_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  return netaddr_from_binary(&key->addr, ptr, value->length, 0);
}